

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLDSA.cpp
# Opt level: O0

bool __thiscall OSSLDSA::signUpdate(OSSLDSA *this,ByteString *dataToSign)

{
  bool bVar1;
  ulong uVar2;
  ByteString *in_RSI;
  AsymmetricAlgorithm *in_RDI;
  ByteString dummy;
  ByteString local_40;
  ByteString *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  bVar1 = AsymmetricAlgorithm::signUpdate(in_RDI,in_RSI);
  if (bVar1) {
    uVar2 = (**(code **)(*in_RDI[1]._vptr_AsymmetricAlgorithm + 0x18))
                      (in_RDI[1]._vptr_AsymmetricAlgorithm,local_18);
    if ((uVar2 & 1) == 0) {
      if (in_RDI[1]._vptr_AsymmetricAlgorithm != (_func_int **)0x0) {
        (**(code **)(*in_RDI[1]._vptr_AsymmetricAlgorithm + 8))();
      }
      in_RDI[1]._vptr_AsymmetricAlgorithm = (_func_int **)0x0;
      ByteString::ByteString((ByteString *)0x1af802);
      AsymmetricAlgorithm::signFinal(in_RDI,&local_40);
      local_1 = 0;
      ByteString::~ByteString((ByteString *)0x1af821);
    }
    else {
      local_1 = 1;
    }
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool OSSLDSA::signUpdate(const ByteString& dataToSign)
{
	if (!AsymmetricAlgorithm::signUpdate(dataToSign))
	{
		return false;
	}

	if (!pCurrentHash->hashUpdate(dataToSign))
	{
		delete pCurrentHash;
		pCurrentHash = NULL;

		ByteString dummy;
		AsymmetricAlgorithm::signFinal(dummy);

		return false;
	}

	return true;
}